

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function_binder.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::TableFunctionBinder::BindExpression
          (BindResult *__return_storage_ptr__,TableFunctionBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  ExpressionClass EVar1;
  BaseExpression *this_00;
  LambdaRefExpression *expr;
  BinderException *this_01;
  string local_48;
  
  this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(expr_ptr)->super_BaseExpression;
  EVar1 = this_00->expression_class;
  if (EVar1 < SUBQUERY) {
    if (EVar1 == COLUMN_REF) {
      BindColumnReference(__return_storage_ptr__,this,expr_ptr,depth,root_expression);
      return __return_storage_ptr__;
    }
    if (EVar1 == DEFAULT) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Table function cannot contain DEFAULT clause","");
      BindResult::BindResult(__return_storage_ptr__,&local_48);
      goto LAB_011fa509;
    }
  }
  else {
    if (EVar1 == WINDOW) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Table function cannot contain window functions!","");
      BindResult::BindResult(__return_storage_ptr__,&local_48);
LAB_011fa509:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_48._M_dataplus._M_p);
      return __return_storage_ptr__;
    }
    if (EVar1 == LAMBDA_REF) {
      expr = BaseExpression::Cast<duckdb::LambdaRefExpression>(this_00);
      BindLambdaReference(__return_storage_ptr__,this,expr,depth);
      return __return_storage_ptr__;
    }
    if (EVar1 == SUBQUERY) {
      this_01 = (BinderException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Table function cannot contain subqueries","");
      BinderException::BinderException(this_01,&local_48);
      __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  ExpressionBinder::BindExpression
            (__return_storage_ptr__,&this->super_ExpressionBinder,expr_ptr,depth,false);
  return __return_storage_ptr__;
}

Assistant:

BindResult TableFunctionBinder::BindExpression(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth,
                                               bool root_expression) {
	auto &expr = *expr_ptr;
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::LAMBDA_REF:
		return BindLambdaReference(expr.Cast<LambdaRefExpression>(), depth);
	case ExpressionClass::COLUMN_REF:
		return BindColumnReference(expr_ptr, depth, root_expression);
	case ExpressionClass::SUBQUERY:
		throw BinderException("Table function cannot contain subqueries");
	case ExpressionClass::DEFAULT:
		return BindResult("Table function cannot contain DEFAULT clause");
	case ExpressionClass::WINDOW:
		return BindResult("Table function cannot contain window functions!");
	default:
		return ExpressionBinder::BindExpression(expr_ptr, depth);
	}
}